

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

string * libtorrent::resolve_redirect_location
                   (string *__return_storage_ptr__,string *referrer,string *location)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  ulong local_150;
  size_t end;
  size_t start;
  size_t i;
  string url;
  string local_d8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined1 local_30 [8];
  error_code ec;
  string *location_local;
  string *referrer_local;
  
  ec.cat_ = (error_category *)location;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)referrer);
    return __return_storage_ptr__;
  }
  boost::system::error_code::error_code((error_code *)local_30);
  std::__cxx11::string::string((string *)&local_d8,(string *)location);
  parse_url_components(&local_b8,&local_d8,(error_code *)local_30);
  std::
  tie<std::_Swallow_assign_const,std::_Swallow_assign_const,std::_Swallow_assign_const,std::_Swallow_assign_const,std::_Swallow_assign_const>
            ((tuple<const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&>
              *)(url.field_2._M_local_buf + 8),(_Swallow_assign *)&std::ignore,
             (_Swallow_assign *)&std::ignore,(_Swallow_assign *)&std::ignore,
             (_Swallow_assign *)&std::ignore,(_Swallow_assign *)&std::ignore);
  std::
  tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&>
  ::operator=((tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&>
               *)(url.field_2._M_local_buf + 8),&local_b8);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_30);
  if (!bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)location);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&i,(string *)referrer);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)location);
  if (*pcVar3 == '/') {
    lVar4 = std::__cxx11::string::find((char *)&i,0x7218c8);
    if (lVar4 == -1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)location);
      goto LAB_002ea4bc;
    }
    lVar4 = std::__cxx11::string::find_first_of((char)&i,0x2f);
    if (lVar4 != -1) {
      std::__cxx11::string::resize((ulong)&i);
    }
    std::__cxx11::string::operator+=((string *)&i,(string *)location);
  }
  else {
    lVar4 = std::__cxx11::string::find((char *)&i,0x7218c8);
    if (lVar4 == -1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)location);
      goto LAB_002ea4bc;
    }
    local_150 = std::__cxx11::string::find_last_of((char)&i,0x2f);
    if (local_150 <= lVar4 + 2U) {
      local_150 = 0xffffffffffffffff;
    }
    if (local_150 != 0xffffffffffffffff) {
      std::__cxx11::string::resize((ulong)&i);
    }
    ensure_trailing_slash((string *)&i);
    std::__cxx11::string::operator+=((string *)&i,(string *)location);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&i);
LAB_002ea4bc:
  std::__cxx11::string::~string((string *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string resolve_redirect_location(std::string referrer
		, std::string location)
	{
		if (location.empty()) return referrer;

		error_code ec;
		using std::ignore;
		std::tie(ignore, ignore, ignore, ignore, ignore)
			= parse_url_components(location, ec);

		// if location is a full URL, just return it
		if (!ec) return location;

		// otherwise it's likely to be just the path, or a relative path
		std::string url = referrer;

		if (location[0] == '/')
		{
			// it's an absolute path. replace the path component of
			// referrer with location.

			// first skip the url scheme of the referer
			std::size_t i = url.find("://");

			// if the referrer doesn't appear to have a proper URL scheme
			// just return the location verbatim (and probably fail)
			if (i == std::string::npos)
				return location;

			// then skip the hostname and port, it's fine for this to fail, in
			// case the referrer doesn't have a path component, it's just the
			// url-scheme and hostname, in which case we just append the location
			i = url.find_first_of('/', i + 3);
			if (i != std::string::npos)
				url.resize(i);

			url += location;
		}
		else
		{
			// some web servers send out relative paths
			// in the location header.

			// remove the leaf filename
			// first skip the url scheme of the referer
			std::size_t start = url.find("://");

			// the referrer is not a valid full URL
			if (start == std::string::npos)
				return location;

			std::size_t end = url.find_last_of('/');
			// if the / we find is part of the scheme, there is no / in the path
			// component or hostname.
			if (end <= start + 2) end = std::string::npos;

			// if this fails, the referrer is just url-scheme and hostname. We can
			// just append the location to it.
			if (end != std::string::npos)
				url.resize(end);

			// however, we may still need to insert a '/' in case neither side
			// has one. We know the location doesn't start with a / already.
			// so, if the referrer doesn't end with one, add it.
			ensure_trailing_slash(url);
			url += location;
		}
		return url;
	}